

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_transform.cc
# Opt level: O0

bool __thiscall
draco::AttributeTransform::TransferToAttribute(AttributeTransform *this,PointAttribute *attribute)

{
  pointer pAVar1;
  unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
  *in_RSI;
  unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
  *in_RDI;
  unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
  transform_data;
  pointer in_stack_ffffffffffffffa8;
  unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
  *in_stack_ffffffffffffffb0;
  PointAttribute *this_00;
  undefined1 local_30 [48];
  
  local_30._32_8_ = in_RSI;
  operator_new(0x30);
  AttributeTransformData::AttributeTransformData((AttributeTransformData *)0x2a3ba2);
  std::unique_ptr<draco::AttributeTransformData,std::default_delete<draco::AttributeTransformData>>
  ::unique_ptr<std::default_delete<draco::AttributeTransformData>,void>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pAVar1 = std::
           unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
           ::get(in_stack_ffffffffffffffb0);
  (*(code *)(((in_RDI->_M_t).
              super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
              ._M_t.
              super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
              .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl)->buffer_)
            .descriptor_.buffer_id)(in_RDI,pAVar1);
  this_00 = (PointAttribute *)local_30;
  std::
  unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>::
  unique_ptr((unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
              *)this_00,
             (unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
              *)local_30._32_8_);
  PointAttribute::SetAttributeTransformData
            (this_00,(unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
                      *)local_30._32_8_);
  std::
  unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>::
  ~unique_ptr(in_RDI);
  std::
  unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>::
  ~unique_ptr(in_RDI);
  return true;
}

Assistant:

bool AttributeTransform::TransferToAttribute(PointAttribute *attribute) const {
  std::unique_ptr<AttributeTransformData> transform_data(
      new AttributeTransformData());
  this->CopyToAttributeTransformData(transform_data.get());
  attribute->SetAttributeTransformData(std::move(transform_data));
  return true;
}